

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

namespace_t __thiscall cs::instance_type::source_import(instance_type *this,string *path)

{
  size_type *psVar1;
  string *cxt;
  slot_type *psVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long *plVar5;
  size_type sVar6;
  bool bVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  size_t sVar8;
  key_arg<std::__cxx11::basic_string<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  namespace_t nVar10;
  context_t rt;
  undefined1 local_59;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  name_space *local_48;
  anon_union_8_1_a8a14541_for_iterator_1 aStack_40;
  
  cxt = path + 9;
  sVar8 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
                      *)(*(long *)path[9]._M_dataplus._M_p + 0x48),in_RDX);
  if (sVar8 == 0) {
    bVar7 = cs_impl::file_system::is_exe(in_RDX);
    if (bVar7) {
      local_48 = (name_space *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cs::extension,std::allocator<cs::extension>,std::__cxx11::string_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0,
                 (extension **)&stack0xffffffffffffffb8,(allocator<cs::extension> *)&local_58,in_RDX
                );
      (this->super_runtime_type).literals.
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .ctrl_ = (ctrl_t *)local_48;
      (this->super_runtime_type).literals.
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .slots_ = (slot_type *)aStack_40;
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
      ::
      emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                  *)&stack0xffffffffffffffb8,
                 (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                  *)&((((__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *)
                       &cxt->_M_dataplus)->_M_ptr->compiler).
                      super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     modules,in_RDX,(shared_ptr<cs::name_space> *)this);
      _Var9._M_pi = extraout_RDX_00;
    }
    else {
      create_subcontext((cs *)&local_58,(context_t *)cxt);
      lVar3 = *local_58;
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_50->_M_use_count = local_50->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_50->_M_use_count = local_50->_M_use_count + 1;
        }
      }
      *(long **)(lVar3 + 0x20) = local_58;
      p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x28);
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x28) = local_50;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      compile((instance_type *)local_58[2],in_RDX);
      plVar5 = (long *)path[9]._M_dataplus._M_p;
      sVar6 = path[9]._M_string_length;
      lVar3 = *plVar5;
      if (sVar6 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(sVar6 + 8) = *(int *)(sVar6 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(sVar6 + 8) = *(int *)(sVar6 + 8) + 1;
        }
      }
      *(long **)(lVar3 + 0x20) = plVar5;
      p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x28);
      *(size_type *)(lVar3 + 0x28) = sVar6;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      interpret((instance_type *)local_58[2]);
      domain_manager::get_namespace((domain_manager *)&stack0xffffffffffffffb8);
      (this->super_runtime_type).literals.
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .ctrl_ = (ctrl_t *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cs::name_space,std::allocator<cs::name_space>,cs::name_space&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_runtime_type).literals.
                  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                  .
                  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                  .slots_,(name_space **)this,(allocator<cs::name_space> *)&local_59,local_48);
      if ((slot_type *)aStack_40.slot_ != (slot_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_40.slot_);
      }
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
      ::
      emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                  *)&stack0xffffffffffffffb8,
                 (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                  *)&((((__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *)
                       &cxt->_M_dataplus)->_M_ptr->compiler).
                      super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     modules,in_RDX,(shared_ptr<cs::name_space> *)this);
      _Var9._M_pi = extraout_RDX_01;
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        _Var9._M_pi = extraout_RDX_02;
      }
    }
  }
  else {
    phmap::priv::
    raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
    ::try_emplace_impl<std::__cxx11::string_const&>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                *)&stack0xffffffffffffffb8,
               &((((__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *)&cxt->_M_dataplus)
                  ->_M_ptr->compiler).
                 super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->modules,
               in_RDX);
    (this->super_runtime_type).literals.
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .ctrl_ = *(ctrl_t **)
              &(((callable *)((long)aStack_40.slot_ + 0x20))->mFunc).super__Function_base._M_functor
    ;
    psVar2 = *(slot_type **)((long)aStack_40.slot_ + 0x28);
    (this->super_runtime_type).literals.
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .slots_ = psVar2;
    _Var9._M_pi = extraout_RDX;
    if (psVar2 != (slot_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(psVar2->value).first._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(psVar2->value).first._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
  }
  nVar10.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  nVar10.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (namespace_t)nVar10.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

namespace_t instance_type::source_import(const std::string &path)
	{
		if (context->compiler->modules.count(path) > 0)
			return context->compiler->modules[path];
		if (cs_impl::file_system::is_exe(path)) {
			// is extension file
			namespace_t module = std::make_shared<extension>(path);
			context->compiler->modules.emplace(path, module);
			return module;
		}
		else {
			// is package file
			context_t rt = create_subcontext(context);
			rt->compiler->swap_context(rt);
			try {
				rt->instance->compile(path);
			}
			catch (...) {
				context->compiler->swap_context(context);
				throw;
			}
			context->compiler->swap_context(context);
			rt->instance->interpret();
			namespace_t module = std::make_shared<name_space>(*rt->instance->storage.get_namespace());
			context->compiler->modules.emplace(path, module);
			return module;
		}
	}